

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UsageTestCase::testPolygonOffset(UsageTestCase *this)

{
  code *pcVar1;
  TestContext *testCtx;
  undefined *puVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  TestLog *this_00;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestError *this_01;
  MessageBuilder *pMVar7;
  VertexShader *vertexShader_;
  FragmentShader *fragmentShader_;
  VertexAttrib *local_ec8;
  ConstPixelBufferAccess local_e18;
  ConstPixelBufferAccess local_df0;
  PrimitiveList local_dc8;
  Program local_da8;
  MultisamplePixelBufferAccess local_d90;
  MultisamplePixelBufferAccess local_d68;
  PixelBufferAccess local_d40;
  MultisamplePixelBufferAccess local_d18;
  RenderTarget local_cf0;
  DrawCommand local_bf8;
  MessageBuilder local_bc8;
  Vector<float,_4> local_a48;
  PixelBufferAccess local_a38;
  Vector<float,_4> local_a10;
  undefined1 local_a00 [8];
  PositionColorShader program_1;
  ViewportState local_894;
  undefined1 local_87c [8];
  RenderState state;
  VertexAttrib attribs [2];
  Renderer local_739;
  undefined1 local_738 [7];
  Renderer referenceRenderer;
  MessageBuilder local_710;
  MessageBuilder local_590;
  MessageBuilder local_410;
  undefined4 local_28c;
  undefined4 local_288;
  GLint colorLoc;
  GLint positionLoc;
  allocator<char> local_259;
  string local_258;
  ProgramSources local_238;
  undefined1 local_168 [8];
  ShaderProgram program;
  Functions *gl;
  undefined1 local_80 [8];
  Surface referenceImage;
  Surface testImage;
  TestLog *log;
  Vec4 triangle [3];
  UsageTestCase *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&log,-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(triangle[0].m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(triangle[1].m_data + 2),1.0,-1.0,0.0,1.0);
  this_00 = tcu::TestContext::getLog
                      ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface((Surface *)&referenceImage.m_pixels.m_cap,iVar4,iVar4);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface((Surface *)local_80,iVar4,iVar4);
  pRVar6 = gles3::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar4);
  pRVar6 = gles3::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  puVar2 = Functional::(anonymous_namespace)::s_shaderSourceVertex;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,puVar2,&local_259);
  puVar2 = Functional::(anonymous_namespace)::s_shaderSourceFragment;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&positionLoc,puVar2,(allocator<char> *)((long)&colorLoc + 3));
  glu::makeVtxFragSources(&local_238,&local_258,(string *)&positionLoc);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_168,pRVar6,&local_238);
  glu::ProgramSources::~ProgramSources(&local_238);
  std::__cxx11::string::~string((string *)&positionLoc);
  std::allocator<char>::~allocator((allocator<char> *)((long)&colorLoc + 3));
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x780);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_168);
  local_288 = (*pcVar1)(dVar5,"a_position");
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x780);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_168);
  local_28c = (*pcVar1)(dVar5,"a_color");
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_168);
  if (!bVar3) {
    glu::operator<<(this_00,(ShaderProgram *)local_168);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Shader compile failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPolygonOffsetTests.cpp"
               ,0x17a);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1d0))(0x3f800000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x188))(0x4100);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1a00))
            (0,0,(this->super_PolygonOffsetTestCase).m_targetSize);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_168);
  (*pcVar1)(dVar5);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x5e0))(0xb71);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x4a0))(0x203);
  tcu::TestLog::operator<<(&local_410,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_410,(char (*) [22])"DepthFunc = GL_LEQUAL");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_410);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x610))(local_288);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x19f0))(local_288,4,0x1406,0,0,&log);
  tcu::TestLog::operator<<(&local_590,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_590,
                      (char (*) [93])
                      "Draw bottom-right. Color = White.\tState: PolygonOffset(0, -2), POLYGON_OFFSET_FILL disabled."
                     );
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_590);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0,0xc0000000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x4e8))(0x8037);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))(0x3f800000,0x3f800000,local_28c);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
  tcu::TestLog::operator<<(&local_710,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_710,
                      (char (*) [90])
                      "Draw bottom-right. Color = Red.\tState: PolygonOffset(0, -1), POLYGON_OFFSET_FILL enabled."
                     );
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_710);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0,0xbf800000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x5e0))(0x8037);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))(0x3f800000,0,local_28c);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x518))(local_288);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1680))(0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x648))();
  pRVar6 = gles3::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)local_738,(Surface *)&referenceImage.m_pixels.m_cap);
  glu::readPixels(pRVar6,0,0,(PixelBufferAccess *)local_738);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_168);
  rr::Renderer::Renderer(&local_739);
  local_ec8 = (VertexAttrib *)&state.restart.restartIndex;
  do {
    rr::VertexAttrib::VertexAttrib(local_ec8);
    local_ec8 = local_ec8 + 1;
  } while (local_ec8 != (VertexAttrib *)((long)&attribs[1].generic.v + 8));
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  rr::WindowRectangle::WindowRectangle
            ((WindowRectangle *)&program_1.super_ShaderProgram.field_0x154,0,0,iVar4,iVar4);
  rr::ViewportState::ViewportState
            (&local_894,(WindowRectangle *)&program_1.super_ShaderProgram.field_0x154);
  rr::RenderState::RenderState((RenderState *)local_87c,&local_894,VIEWPORTORIENTATION_LOWER_LEFT);
  PositionColorShader::PositionColorShader((PositionColorShader *)local_a00);
  state.restart.restartIndex = 0;
  state.viewportOrientation = 4;
  attribs[0].type = VERTEXATTRIBTYPE_FLOAT;
  attribs[0].size = 0;
  attribs[0]._8_8_ = &log;
  attribs[0].generic.v.uData[2] = 0x22;
  tcu::Vector<float,_4>::Vector(&local_a10,1.0,0.0,0.0,1.0);
  rr::GenericVec4::operator=((GenericVec4 *)&attribs[1].pointer,&local_a10);
  tcu::Surface::getAccess(&local_a38,(Surface *)local_80);
  tcu::Vector<float,_4>::Vector(&local_a48,0.0,0.0,0.0,1.0);
  tcu::clear(&local_a38,&local_a48);
  tcu::TestLog::operator<<(&local_bc8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_bc8,(char (*) [31])"Expecting: Bottom-right = Red.");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_bc8);
  tcu::Surface::getAccess(&local_d40,(Surface *)local_80);
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(&local_d18,&local_d40);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_d68);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_d90);
  rr::RenderTarget::RenderTarget(&local_cf0,&local_d18,&local_d68,&local_d90);
  vertexShader_ = sglr::ShaderProgram::getVertexShader((ShaderProgram *)local_a00);
  fragmentShader_ = sglr::ShaderProgram::getFragmentShader((ShaderProgram *)local_a00);
  rr::Program::Program(&local_da8,vertexShader_,fragmentShader_,(GeometryShader *)0x0);
  rr::PrimitiveList::PrimitiveList(&local_dc8,PRIMITIVETYPE_TRIANGLES,3,0);
  rr::DrawCommand::DrawCommand
            (&local_bf8,(RenderState *)local_87c,&local_cf0,&local_da8,2,
             (VertexAttrib *)&state.restart.restartIndex,&local_dc8);
  rr::Renderer::draw(&local_739,&local_bf8);
  PositionColorShader::~PositionColorShader((PositionColorShader *)local_a00);
  rr::Renderer::~Renderer(&local_739);
  testCtx = (this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx;
  pRVar6 = gles3::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_df0,(Surface *)&referenceImage.m_pixels.m_cap)
  ;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_e18,(Surface *)local_80);
  verifyImages(this_00,testCtx,pRVar6,&local_df0,&local_e18);
  tcu::Surface::~Surface((Surface *)local_80);
  tcu::Surface::~Surface((Surface *)&referenceImage.m_pixels.m_cap);
  return;
}

Assistant:

void UsageTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	const tcu::Vec4 triangle[] =
	{
		tcu::Vec4(-1,  1,  0,  1),
		tcu::Vec4( 1,  1,  0,  1),
		tcu::Vec4( 1, -1,  0,  1),
	};

	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// render test image
	{
		const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program		(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc = gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc	= gl.getAttribLocation(program.getProgram(), "a_color");

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.depthFunc				(GL_LEQUAL);	// make test pass if polygon offset doesn't do anything. It has its own test case. This test is only for to detect always-on cases.

		log << TestLog::Message << "DepthFunc = GL_LEQUAL" << TestLog::EndMessage;

		gl.enableVertexAttribArray	(positionLoc);
		gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangle);

		//draw back (offset disabled)

		log << TestLog::Message << "Draw bottom-right. Color = White.\tState: PolygonOffset(0, -2), POLYGON_OFFSET_FILL disabled." << TestLog::EndMessage;

		gl.polygonOffset			(0, -2);
		gl.disable					(GL_POLYGON_OFFSET_FILL);
		gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
		gl.drawArrays				(GL_TRIANGLES, 0, 3);

		//draw front

		log << TestLog::Message << "Draw bottom-right. Color = Red.\tState: PolygonOffset(0, -1), POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		gl.polygonOffset			(0, -1);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.vertexAttrib4f			(colorLoc, 1.0f, 0.0f, 0.0f, 1.0f);
		gl.drawArrays				(GL_TRIANGLES, 0, 3);

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	{
		rr::Renderer		referenceRenderer;
		rr::VertexAttrib	attribs[2];
		rr::RenderState		state((rr::ViewportState)(rr::WindowRectangle(0, 0, m_targetSize, m_targetSize)));

		PositionColorShader program;

		attribs[0].type				= rr::VERTEXATTRIBTYPE_FLOAT;
		attribs[0].size				= 4;
		attribs[0].stride			= 0;
		attribs[0].instanceDivisor	= 0;
		attribs[0].pointer			= triangle;

		attribs[1].type				= rr::VERTEXATTRIBTYPE_DONT_CARE;
		attribs[1].generic			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);

		tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

		log << TestLog::Message << "Expecting: Bottom-right = Red." << TestLog::EndMessage;

		referenceRenderer.draw(
			rr::DrawCommand(
				state,
				rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(referenceImage.getAccess())),
				rr::Program(program.getVertexShader(), program.getFragmentShader()),
				2,
				attribs,
				rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, 3, 0)));
	}

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}